

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall CentralBroker::~CentralBroker(CentralBroker *this)

{
  zactor_t **in_RDI;
  
  if ((*(byte *)((long)in_RDI + 0x5c) & 1) != 0) {
    zactor_destroy(in_RDI + 1);
  }
  if (in_RDI[2] != (zactor_t *)0x0) {
    (**(code **)(*(long *)in_RDI[2] + 8))();
  }
  zactor_destroy(in_RDI);
  zsys_shutdown();
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  return;
}

Assistant:

CentralBroker::~CentralBroker() {
    if(initialized){
        zactor_destroy(&logger);
    }
    delete brokerHandle;
    zactor_destroy(&broker);
    zsys_shutdown();
}